

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

int __thiscall Assimp::ColladaParser::TestAttribute(ColladaParser *this,char *pAttr)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < iVar1) {
    uVar3 = 0;
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar3);
      iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),pAttr);
      if (iVar1 == 0) {
        return (int)uVar3;
      }
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[4])();
    } while ((int)uVar2 < iVar1);
  }
  return -1;
}

Assistant:

int ColladaParser::TestAttribute(const char* pAttr) const
{
    for (int a = 0; a < mReader->getAttributeCount(); a++)
        if (strcmp(mReader->getAttributeName(a), pAttr) == 0)
            return a;

    return -1;
}